

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O0

bool __thiscall inja::Parser::parse_statement(Parser *this,Template *tmpl,string_view path)

{
  function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
  *this_00;
  value_type vVar1;
  basic_string_view<char,_std::char_traits<char>_> lhs;
  basic_string_view<char,_std::char_traits<char>_> lhs_00;
  basic_string_view<char,_std::char_traits<char>_> lhs_01;
  basic_string_view<char,_std::char_traits<char>_> lhs_02;
  basic_string_view<char,_std::char_traits<char>_> lhs_03;
  basic_string_view<char,_std::char_traits<char>_> lhs_04;
  basic_string_view<char,_std::char_traits<char>_> lhs_05;
  basic_string_view<char,_std::char_traits<char>_> lhs_06;
  Template *pTVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  reference pvVar7;
  reference puVar8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_01;
  size_type sVar9;
  reference pvVar10;
  reference pvVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template>_>,_bool>
  pVar13;
  bool local_641;
  bool local_621;
  Flag local_5dc;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_5d8;
  Op local_5c1;
  _Base_ptr local_5c0;
  undefined1 local_5b8;
  string_view local_5b0;
  undefined1 local_5a0 [8];
  Template include_template;
  string pathname;
  input_adapter local_528;
  undefined1 local_518 [8];
  json json_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  allocator local_4a1;
  string local_4a0;
  type local_480;
  const_pointer local_470;
  size_type local_468;
  Op local_45a;
  allocator local_459;
  string local_458;
  allocator local_431;
  string local_430;
  type local_410;
  const_pointer local_400;
  size_type local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_3d0;
  Op local_3bd;
  value_type_conflict2 local_3bc;
  string local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  allocator local_351;
  string local_350;
  type local_330;
  const_pointer local_320;
  size_type local_318;
  string local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  allocator local_2a9;
  string local_2a8;
  undefined1 local_288 [8];
  Token key_token;
  Token value_token;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  allocator local_1f1;
  string local_1f0;
  type local_1d0;
  const_pointer local_1c0;
  size_type local_1b8;
  Op local_1a9;
  type local_1a8;
  const_pointer local_198;
  size_type local_190;
  Op local_185;
  value_type_conflict2 local_184;
  reference local_180;
  value_type *if_data_1;
  string local_170;
  allocator local_149;
  string local_148;
  type local_128;
  const_pointer local_118;
  size_type local_110;
  uint local_104;
  iterator iStack_100;
  uint i;
  iterator __end4;
  iterator __begin4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range4;
  value_type *if_data;
  string local_d8;
  allocator local_a1;
  string local_a0;
  type local_80;
  const_pointer local_70;
  size_type local_68;
  Op local_59;
  size_type local_58;
  type local_50;
  const_pointer local_40;
  size_type local_38;
  Template *local_30;
  Template *tmpl_local;
  Parser *this_local;
  string_view path_local;
  
  path_local.data_ = (const_pointer)path.size_;
  this_local = (Parser *)path.data_;
  if ((this->m_tok).kind == Id) {
    local_40 = (this->m_tok).text.data_;
    local_38 = (this->m_tok).text.size_;
    local_30 = tmpl;
    tmpl_local = (Template *)this;
    nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_50,"if");
    lhs_06.size_ = local_38;
    lhs_06.data_ = local_40;
    bVar3 = nonstd::sv_lite::operator==(lhs_06,local_50);
    if (bVar3) {
      get_next_token(this);
      bVar3 = parse_expression(this,local_30);
      if (!bVar3) {
        return false;
      }
      local_58 = std::vector<inja::Bytecode,_std::allocator<inja::Bytecode>_>::size
                           (&local_30->bytecodes);
      std::vector<inja::Parser::IfData,_std::allocator<inja::Parser::IfData>_>::
      emplace_back<unsigned_long>(&this->m_if_stack,&local_58);
      local_59 = ConditionalJump;
      std::vector<inja::Bytecode,_std::allocator<inja::Bytecode>_>::emplace_back<inja::Bytecode::Op>
                (&local_30->bytecodes,&local_59);
    }
    else {
      local_70 = (this->m_tok).text.data_;
      local_68 = (this->m_tok).text.size_;
      nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_80,"endif");
      lhs_05.size_ = local_68;
      lhs_05.data_ = local_70;
      bVar3 = nonstd::sv_lite::operator==(lhs_05,local_80);
      if (bVar3) {
        bVar3 = std::vector<inja::Parser::IfData,_std::allocator<inja::Parser::IfData>_>::empty
                          (&this->m_if_stack);
        if (bVar3) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_a0,"parser_error",&local_a1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_d8,"endif without matching if",
                     (allocator *)((long)&if_data + 7));
          inja_throw(&local_a0,&local_d8);
          std::__cxx11::string::~string((string *)&local_d8);
          std::allocator<char>::~allocator((allocator<char> *)((long)&if_data + 7));
          std::__cxx11::string::~string((string *)&local_a0);
          std::allocator<char>::~allocator((allocator<char> *)&local_a1);
        }
        pvVar7 = std::vector<inja::Parser::IfData,_std::allocator<inja::Parser::IfData>_>::back
                           (&this->m_if_stack);
        get_next_token(this);
        uVar5 = pvVar7->prev_cond_jump;
        uVar4 = std::numeric_limits<unsigned_int>::max();
        if (uVar5 != uVar4) {
          sVar9 = std::vector<inja::Bytecode,_std::allocator<inja::Bytecode>_>::size
                            (&local_30->bytecodes);
          pvVar11 = std::vector<inja::Bytecode,_std::allocator<inja::Bytecode>_>::operator[]
                              (&local_30->bytecodes,(ulong)pvVar7->prev_cond_jump);
          *(uint *)&pvVar11->field_0x4 =
               *(uint *)&pvVar11->field_0x4 & 0xc0000000 | (uint)sVar9 & 0x3fffffff;
        }
        __end4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                           (&pvVar7->uncond_jumps);
        iStack_100 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                               (&pvVar7->uncond_jumps);
        while (bVar3 = __gnu_cxx::operator!=(&__end4,&stack0xffffffffffffff00), bVar3) {
          puVar8 = __gnu_cxx::
                   __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                   ::operator*(&__end4);
          local_104 = *puVar8;
          sVar9 = std::vector<inja::Bytecode,_std::allocator<inja::Bytecode>_>::size
                            (&local_30->bytecodes);
          pvVar11 = std::vector<inja::Bytecode,_std::allocator<inja::Bytecode>_>::operator[]
                              (&local_30->bytecodes,(ulong)local_104);
          *(uint *)&pvVar11->field_0x4 =
               *(uint *)&pvVar11->field_0x4 & 0xc0000000 | (uint)sVar9 & 0x3fffffff;
          __gnu_cxx::
          __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
          ::operator++(&__end4);
        }
        std::vector<inja::Parser::IfData,_std::allocator<inja::Parser::IfData>_>::pop_back
                  (&this->m_if_stack);
      }
      else {
        local_118 = (this->m_tok).text.data_;
        local_110 = (this->m_tok).text.size_;
        nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_128,"else");
        lhs_04.size_ = local_110;
        lhs_04.data_ = local_118;
        bVar3 = nonstd::sv_lite::operator==(lhs_04,local_128);
        if (bVar3) {
          bVar3 = std::vector<inja::Parser::IfData,_std::allocator<inja::Parser::IfData>_>::empty
                            (&this->m_if_stack);
          if (bVar3) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_148,"parser_error",&local_149);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_170,"else without matching if",
                       (allocator *)((long)&if_data_1 + 7));
            inja_throw(&local_148,&local_170);
            std::__cxx11::string::~string((string *)&local_170);
            std::allocator<char>::~allocator((allocator<char> *)((long)&if_data_1 + 7));
            std::__cxx11::string::~string((string *)&local_148);
            std::allocator<char>::~allocator((allocator<char> *)&local_149);
          }
          local_180 = std::vector<inja::Parser::IfData,_std::allocator<inja::Parser::IfData>_>::back
                                (&this->m_if_stack);
          get_next_token(this);
          this_01 = &local_180->uncond_jumps;
          sVar9 = std::vector<inja::Bytecode,_std::allocator<inja::Bytecode>_>::size
                            (&local_30->bytecodes);
          local_184 = (value_type_conflict2)sVar9;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(this_01,&local_184);
          local_185 = Jump;
          std::vector<inja::Bytecode,_std::allocator<inja::Bytecode>_>::
          emplace_back<inja::Bytecode::Op>(&local_30->bytecodes,&local_185);
          sVar9 = std::vector<inja::Bytecode,_std::allocator<inja::Bytecode>_>::size
                            (&local_30->bytecodes);
          pvVar11 = std::vector<inja::Bytecode,_std::allocator<inja::Bytecode>_>::operator[]
                              (&local_30->bytecodes,(ulong)local_180->prev_cond_jump);
          *(uint *)&pvVar11->field_0x4 =
               *(uint *)&pvVar11->field_0x4 & 0xc0000000 | (uint)sVar9 & 0x3fffffff;
          uVar5 = std::numeric_limits<unsigned_int>::max();
          local_180->prev_cond_jump = uVar5;
          local_621 = false;
          if ((this->m_tok).kind == Id) {
            local_198 = (this->m_tok).text.data_;
            local_190 = (this->m_tok).text.size_;
            nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_1a8,"if");
            lhs_03.size_ = local_190;
            lhs_03.data_ = local_198;
            local_621 = nonstd::sv_lite::operator==(lhs_03,local_1a8);
          }
          if (local_621 != false) {
            get_next_token(this);
            bVar3 = parse_expression(this,local_30);
            if (!bVar3) {
              return false;
            }
            sVar9 = std::vector<inja::Bytecode,_std::allocator<inja::Bytecode>_>::size
                              (&local_30->bytecodes);
            local_180->prev_cond_jump = (uint)sVar9;
            local_1a9 = ConditionalJump;
            std::vector<inja::Bytecode,_std::allocator<inja::Bytecode>_>::
            emplace_back<inja::Bytecode::Op>(&local_30->bytecodes,&local_1a9);
          }
        }
        else {
          local_1c0 = (this->m_tok).text.data_;
          local_1b8 = (this->m_tok).text.size_;
          nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_1d0,"for");
          lhs_02.size_ = local_1b8;
          lhs_02.data_ = local_1c0;
          bVar3 = nonstd::sv_lite::operator==(lhs_02,local_1d0);
          if (bVar3) {
            get_next_token(this);
            if ((this->m_tok).kind != Id) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_1f0,"parser_error",&local_1f1);
              Token::describe_abi_cxx11_((string *)&value_token.text.size_,&this->m_tok);
              std::operator+(&local_238,"expected id, got \'",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &value_token.text.size_);
              std::operator+(&local_218,&local_238,"\'");
              inja_throw(&local_1f0,&local_218);
              std::__cxx11::string::~string((string *)&local_218);
              std::__cxx11::string::~string((string *)&local_238);
              std::__cxx11::string::~string((string *)&value_token.text.size_);
              std::__cxx11::string::~string((string *)&local_1f0);
              std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
            }
            key_token.text.size_ = *(size_type *)&this->m_tok;
            value_token._0_8_ = (this->m_tok).text.data_;
            value_token.text.data_ = (const_pointer)(this->m_tok).text.size_;
            get_next_token(this);
            Token::Token((Token *)local_288);
            if ((this->m_tok).kind == Comma) {
              get_next_token(this);
              if ((this->m_tok).kind != Id) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string((string *)&local_2a8,"parser_error",&local_2a9);
                Token::describe_abi_cxx11_(&local_310,&this->m_tok);
                std::operator+(&local_2f0,"expected id, got \'",&local_310);
                std::operator+(&local_2d0,&local_2f0,"\'");
                inja_throw(&local_2a8,&local_2d0);
                std::__cxx11::string::~string((string *)&local_2d0);
                std::__cxx11::string::~string((string *)&local_2f0);
                std::__cxx11::string::~string((string *)&local_310);
                std::__cxx11::string::~string((string *)&local_2a8);
                std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
              }
              local_288 = (undefined1  [8])key_token.text.size_;
              key_token.kind = value_token.kind;
              key_token._4_4_ = value_token._4_4_;
              key_token.text.data_ = value_token.text.data_;
              key_token.text.size_ = *(size_type *)&this->m_tok;
              value_token._0_8_ = (this->m_tok).text.data_;
              value_token.text.data_ = (const_pointer)(this->m_tok).text.size_;
              get_next_token(this);
            }
            local_641 = true;
            if ((this->m_tok).kind == Id) {
              local_320 = (this->m_tok).text.data_;
              local_318 = (this->m_tok).text.size_;
              nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (&local_330,"in");
              lhs_01.size_ = local_318;
              lhs_01.data_ = local_320;
              local_641 = nonstd::sv_lite::operator!=(lhs_01,local_330);
            }
            if (local_641 != false) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_350,"parser_error",&local_351);
              Token::describe_abi_cxx11_(&local_3b8,&this->m_tok);
              std::operator+(&local_398,"expected \'in\', got \'",&local_3b8);
              std::operator+(&local_378,&local_398,"\'");
              inja_throw(&local_350,&local_378);
              std::__cxx11::string::~string((string *)&local_378);
              std::__cxx11::string::~string((string *)&local_398);
              std::__cxx11::string::~string((string *)&local_3b8);
              std::__cxx11::string::~string((string *)&local_350);
              std::allocator<char>::~allocator((allocator<char> *)&local_351);
            }
            get_next_token(this);
            bVar3 = parse_expression(this,local_30);
            if (!bVar3) {
              return false;
            }
            sVar9 = std::vector<inja::Bytecode,_std::allocator<inja::Bytecode>_>::size
                              (&local_30->bytecodes);
            local_3bc = (value_type_conflict2)sVar9;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      (&this->m_loop_stack,&local_3bc);
            local_3bd = StartLoop;
            std::vector<inja::Bytecode,_std::allocator<inja::Bytecode>_>::
            emplace_back<inja::Bytecode::Op>(&local_30->bytecodes,&local_3bd);
            bVar3 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::empty
                              ((basic_string_view<char,_std::char_traits<char>_> *)&key_token);
            if (!bVar3) {
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::
              basic_json<nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>_&,_nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>,_0>
                        (&local_3d0,(basic_string_view<char,_std::char_traits<char>_> *)&key_token);
              pvVar11 = std::vector<inja::Bytecode,_std::allocator<inja::Bytecode>_>::back
                                  (&local_30->bytecodes);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::operator=(&pvVar11->value,&local_3d0);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::~basic_json(&local_3d0);
            }
            nonstd::sv_lite::basic_string_view::operator_cast_to_string
                      (&local_3f0,(basic_string_view *)&value_token);
            pvVar11 = std::vector<inja::Bytecode,_std::allocator<inja::Bytecode>_>::back
                                (&local_30->bytecodes);
            std::__cxx11::string::operator=((string *)&pvVar11->str,(string *)&local_3f0);
            std::__cxx11::string::~string((string *)&local_3f0);
          }
          else {
            local_400 = (this->m_tok).text.data_;
            local_3f8 = (this->m_tok).text.size_;
            nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_410,"endfor");
            lhs_00.size_ = local_3f8;
            lhs_00.data_ = local_400;
            bVar3 = nonstd::sv_lite::operator==(lhs_00,local_410);
            if (bVar3) {
              get_next_token(this);
              bVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                                (&this->m_loop_stack);
              if (bVar3) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string((string *)&local_430,"parser_error",&local_431);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)&local_458,"endfor without matching for",&local_459);
                inja_throw(&local_430,&local_458);
                std::__cxx11::string::~string((string *)&local_458);
                std::allocator<char>::~allocator((allocator<char> *)&local_459);
                std::__cxx11::string::~string((string *)&local_430);
                std::allocator<char>::~allocator((allocator<char> *)&local_431);
              }
              sVar9 = std::vector<inja::Bytecode,_std::allocator<inja::Bytecode>_>::size
                                (&local_30->bytecodes);
              pTVar2 = local_30;
              pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back
                                  (&this->m_loop_stack);
              pvVar11 = std::vector<inja::Bytecode,_std::allocator<inja::Bytecode>_>::operator[]
                                  (&pTVar2->bytecodes,(ulong)*pvVar10);
              *(uint *)&pvVar11->field_0x4 =
                   *(uint *)&pvVar11->field_0x4 & 0xc0000000 | (uint)sVar9 & 0x3fffffff;
              local_45a = EndLoop;
              std::vector<inja::Bytecode,_std::allocator<inja::Bytecode>_>::
              emplace_back<inja::Bytecode::Op>(&local_30->bytecodes,&local_45a);
              pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back
                                  (&this->m_loop_stack);
              vVar1 = *pvVar10;
              pvVar11 = std::vector<inja::Bytecode,_std::allocator<inja::Bytecode>_>::back
                                  (&local_30->bytecodes);
              *(uint *)&pvVar11->field_0x4 =
                   *(uint *)&pvVar11->field_0x4 & 0xc0000000 | vVar1 + 1 & 0x3fffffff;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::pop_back
                        (&this->m_loop_stack);
            }
            else {
              local_470 = (this->m_tok).text.data_;
              local_468 = (this->m_tok).text.size_;
              nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (&local_480,"include");
              lhs.size_ = local_468;
              lhs.data_ = local_470;
              bVar3 = nonstd::sv_lite::operator==(lhs,local_480);
              if (!bVar3) {
                return false;
              }
              get_next_token(this);
              if ((this->m_tok).kind != String) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string((string *)&local_4a0,"parser_error",&local_4a1);
                Token::describe_abi_cxx11_((string *)&json_name.m_value,&this->m_tok);
                std::operator+(&local_4e8,"expected string, got \'",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &json_name.m_value);
                std::operator+(&local_4c8,&local_4e8,"\'");
                inja_throw(&local_4a0,&local_4c8);
                std::__cxx11::string::~string((string *)&local_4c8);
                std::__cxx11::string::~string((string *)&local_4e8);
                std::__cxx11::string::~string((string *)&json_name.m_value.boolean);
                std::__cxx11::string::~string((string *)&local_4a0);
                std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
              }
              nlohmann::detail::input_adapter::
              input_adapter<nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>,_0>
                        (&local_528,&(this->m_tok).text);
              this_00 = (function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
                         *)((long)&pathname.field_2 + 8);
              std::
              function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
              ::function(this_00,(nullptr_t)0x0);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::parse((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)local_518,&local_528,this_00,true);
              std::
              function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
              ::~function((function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
                           *)((long)&pathname.field_2 + 8));
              nlohmann::detail::input_adapter::~input_adapter(&local_528);
              nonstd::sv_lite::basic_string_view::operator_cast_to_string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&include_template.content.field_2 + 8),
                         (basic_string_view *)&this_local);
              pbVar12 = nlohmann::
                        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        ::
                        get_ref<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                    *)local_518);
              std::__cxx11::string::operator+=
                        ((string *)(include_template.content.field_2._M_local_buf + 8),
                         (string *)pbVar12);
              iVar6 = std::__cxx11::string::compare
                                ((ulong)((long)&include_template.content.field_2 + 8),0,(char *)0x2)
              ;
              if (iVar6 == 0) {
                std::__cxx11::string::erase((ulong)((long)&include_template.content.field_2 + 8),0);
              }
              nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>::
              basic_string_view<std::allocator<char>>
                        ((basic_string_view<char,std::char_traits<char>> *)&local_5b0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&include_template.content.field_2 + 8));
              parse_template((Template *)local_5a0,this,local_5b0);
              pVar13 = std::
                       map<std::__cxx11::string,inja::Template,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,inja::Template>>>
                       ::emplace<std::__cxx11::string&,inja::Template&>
                                 ((map<std::__cxx11::string,inja::Template,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,inja::Template>>>
                                   *)this->m_included_templates,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&include_template.content.field_2 + 8),
                                  (Template *)local_5a0);
              pTVar2 = local_30;
              local_5c0 = (_Base_ptr)pVar13.first._M_node;
              local_5b8 = pVar13.second;
              local_5c1 = Include;
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::
              basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (&local_5d8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&include_template.content.field_2 + 8));
              local_5dc = ValueImmediate;
              std::vector<inja::Bytecode,std::allocator<inja::Bytecode>>::
              emplace_back<inja::Bytecode::Op,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,inja::Bytecode::Flag>
                        ((vector<inja::Bytecode,std::allocator<inja::Bytecode>> *)pTVar2,&local_5c1,
                         &local_5d8,&local_5dc);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::~basic_json(&local_5d8);
              get_next_token(this);
              Template::~Template((Template *)local_5a0);
              std::__cxx11::string::~string
                        ((string *)(include_template.content.field_2._M_local_buf + 8));
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                             *)local_518);
            }
          }
        }
      }
    }
    path_local.size_._7_1_ = true;
  }
  else {
    path_local.size_._7_1_ = false;
  }
  return path_local.size_._7_1_;
}

Assistant:

bool parse_statement(Template& tmpl, nonstd::string_view path) {
		if (m_tok.kind != Token::Kind::Id) return false;

		if (m_tok.text == "if") {
			get_next_token();

			// evaluate expression
			if (!parse_expression(tmpl)) return false;

			// start a new if block on if stack
			m_if_stack.emplace_back(tmpl.bytecodes.size());

			// conditional jump; destination will be filled in by else or endif
			tmpl.bytecodes.emplace_back(Bytecode::Op::ConditionalJump);
		} else if (m_tok.text == "endif") {
			if (m_if_stack.empty()) {
				inja_throw("parser_error", "endif without matching if");
			}
			auto& if_data = m_if_stack.back();
			get_next_token();

			// previous conditional jump jumps here
			if (if_data.prev_cond_jump != std::numeric_limits<unsigned int>::max()) {
				tmpl.bytecodes[if_data.prev_cond_jump].args = tmpl.bytecodes.size();
			}

			// update all previous unconditional jumps to here
			for (unsigned int i : if_data.uncond_jumps) {
				tmpl.bytecodes[i].args = tmpl.bytecodes.size();
			}

			// pop if stack
			m_if_stack.pop_back();
		} else if (m_tok.text == "else") {
			if (m_if_stack.empty()) inja_throw("parser_error", "else without matching if");
			auto& if_data = m_if_stack.back();
			get_next_token();

			// end previous block with unconditional jump to endif; destination will be
			// filled in by endif
			if_data.uncond_jumps.push_back(tmpl.bytecodes.size());
			tmpl.bytecodes.emplace_back(Bytecode::Op::Jump);

			// previous conditional jump jumps here
			tmpl.bytecodes[if_data.prev_cond_jump].args = tmpl.bytecodes.size();
			if_data.prev_cond_jump = std::numeric_limits<unsigned int>::max();

			// chained else if
			if (m_tok.kind == Token::Kind::Id && m_tok.text == "if") {
				get_next_token();

				// evaluate expression
				if (!parse_expression(tmpl)) return false;

				// update "previous jump"
				if_data.prev_cond_jump = tmpl.bytecodes.size();

				// conditional jump; destination will be filled in by else or endif
				tmpl.bytecodes.emplace_back(Bytecode::Op::ConditionalJump);
			}
		} else if (m_tok.text == "for") {
			get_next_token();

			// options: for a in arr; for a, b in obj
			if (m_tok.kind != Token::Kind::Id)
				inja_throw("parser_error", "expected id, got '" + m_tok.describe() + "'");
			Token value_token = m_tok;
			get_next_token();

			Token key_token;
			if (m_tok.kind == Token::Kind::Comma) {
				get_next_token();
				if (m_tok.kind != Token::Kind::Id)
					inja_throw("parser_error", "expected id, got '" + m_tok.describe() + "'");
				key_token = std::move(value_token);
				value_token = m_tok;
				get_next_token();
			}

			if (m_tok.kind != Token::Kind::Id || m_tok.text != "in")
				inja_throw("parser_error", "expected 'in', got '" + m_tok.describe() + "'");
			get_next_token();

			if (!parse_expression(tmpl)) return false;

			m_loop_stack.push_back(tmpl.bytecodes.size());

			tmpl.bytecodes.emplace_back(Bytecode::Op::StartLoop);
			if (!key_token.text.empty()) {
				tmpl.bytecodes.back().value = key_token.text;
			}
			tmpl.bytecodes.back().str = static_cast<std::string>(value_token.text);
		} else if (m_tok.text == "endfor") {
			get_next_token();
			if (m_loop_stack.empty()) {
				inja_throw("parser_error", "endfor without matching for");
			}

			// update loop with EndLoop index (for empty case)
			tmpl.bytecodes[m_loop_stack.back()].args = tmpl.bytecodes.size();

			tmpl.bytecodes.emplace_back(Bytecode::Op::EndLoop);
			tmpl.bytecodes.back().args = m_loop_stack.back() + 1;  // loop body
			m_loop_stack.pop_back();
		} else if (m_tok.text == "include") {
			get_next_token();

			if (m_tok.kind != Token::Kind::String) {
				inja_throw("parser_error", "expected string, got '" + m_tok.describe() + "'");
			}

			// build the relative path
			json json_name = json::parse(m_tok.text);
			std::string pathname = static_cast<std::string>(path);
			pathname += json_name.get_ref<const std::string&>();
			if (pathname.compare(0, 2, "./") == 0) {
				pathname.erase(0, 2);
			}
			// sys::path::remove_dots(pathname, true, sys::path::Style::posix);

			Template include_template = parse_template(pathname);
			m_included_templates.emplace(pathname, include_template);

			// generate a reference bytecode
			tmpl.bytecodes.emplace_back(Bytecode::Op::Include, json(pathname), Bytecode::Flag::ValueImmediate);

			get_next_token();
		} else {
			return false;
		}
		return true;
	}